

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSapBroadphase.cpp
# Opt level: O2

void __thiscall
btMultiSapBroadphase::btMultiSapBroadphase
          (btMultiSapBroadphase *this,int param_1,btOverlappingPairCache *pairCache)

{
  btSortedOverlappingPairCache *this_00;
  btOverlapFilterCallback *pbVar1;
  
  (this->super_btBroadphaseInterface)._vptr_btBroadphaseInterface =
       (_func_int **)&PTR__btMultiSapBroadphase_001ec2c8;
  (this->m_sapBroadphases).m_ownsMemory = true;
  (this->m_sapBroadphases).m_data = (btBroadphaseInterface **)0x0;
  (this->m_sapBroadphases).m_size = 0;
  (this->m_sapBroadphases).m_capacity = 0;
  this->m_overlappingPairs = pairCache;
  this->m_optimizedAabbTree = (btQuantizedBvh *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  (this->m_multiSapProxies).m_ownsMemory = true;
  (this->m_multiSapProxies).m_data = (btMultiSapProxy **)0x0;
  (this->m_multiSapProxies).m_size = 0;
  (this->m_multiSapProxies).m_capacity = 0;
  if (pairCache == (btOverlappingPairCache *)0x0) {
    this->m_ownsPairCache = true;
    this_00 = (btSortedOverlappingPairCache *)btAlignedAllocInternal(0x40,0x10);
    btSortedOverlappingPairCache::btSortedOverlappingPairCache(this_00);
    this->m_overlappingPairs = (btOverlappingPairCache *)this_00;
  }
  pbVar1 = (btOverlapFilterCallback *)btAlignedAllocInternal(8,0x10);
  pbVar1->_vptr_btOverlapFilterCallback = (_func_int **)&PTR__btOverlapFilterCallback_001ec360;
  this->m_filterCallback = pbVar1;
  (*(this->m_overlappingPairs->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[0xb]
  )(this->m_overlappingPairs,pbVar1);
  return;
}

Assistant:

btMultiSapBroadphase::btMultiSapBroadphase(int /*maxProxies*/,btOverlappingPairCache* pairCache)
:m_overlappingPairs(pairCache),
m_optimizedAabbTree(0),
m_ownsPairCache(false),
m_invalidPair(0)
{
	if (!m_overlappingPairs)
	{
		m_ownsPairCache = true;
		void* mem = btAlignedAlloc(sizeof(btSortedOverlappingPairCache),16);
		m_overlappingPairs = new (mem)btSortedOverlappingPairCache();
	}

	struct btMultiSapOverlapFilterCallback : public btOverlapFilterCallback
	{
		virtual ~btMultiSapOverlapFilterCallback()
		{}
		// return true when pairs need collision
		virtual bool	needBroadphaseCollision(btBroadphaseProxy* childProxy0,btBroadphaseProxy* childProxy1) const
		{
			btBroadphaseProxy* multiProxy0 = (btBroadphaseProxy*)childProxy0->m_multiSapParentProxy;
			btBroadphaseProxy* multiProxy1 = (btBroadphaseProxy*)childProxy1->m_multiSapParentProxy;
			
			bool collides = (multiProxy0->m_collisionFilterGroup & multiProxy1->m_collisionFilterMask) != 0;
			collides = collides && (multiProxy1->m_collisionFilterGroup & multiProxy0->m_collisionFilterMask);
	
			return collides;
		}
	};

	void* mem = btAlignedAlloc(sizeof(btMultiSapOverlapFilterCallback),16);
	m_filterCallback = new (mem)btMultiSapOverlapFilterCallback();

	m_overlappingPairs->setOverlapFilterCallback(m_filterCallback);
//	mem = btAlignedAlloc(sizeof(btSimpleBroadphase),16);
//	m_simpleBroadphase = new (mem) btSimpleBroadphase(maxProxies,m_overlappingPairs);
}